

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O1

DSA * DSA_parse_private_key(CBS *cbs)

{
  int iVar1;
  DSA *dsa;
  DSA *pDVar2;
  int line;
  CBS child;
  uint64_t version;
  CBS CStack_28;
  uint64_t local_18;
  
  dsa = DSA_new();
  pDVar2 = dsa;
  if (dsa == (DSA *)0x0) {
    dsa = (DSA *)0x0;
  }
  else {
    iVar1 = CBS_get_asn1(cbs,&CStack_28,0x20000010);
    if ((iVar1 == 0) || (iVar1 = CBS_get_asn1_uint64(&CStack_28,&local_18), iVar1 == 0)) {
      iVar1 = 0x69;
      line = 0xd8;
    }
    else if (local_18 == 0) {
      iVar1 = parse_integer(&CStack_28,(BIGNUM **)dsa);
      if ((((iVar1 != 0) && (iVar1 = parse_integer(&CStack_28,(BIGNUM **)&dsa->version), iVar1 != 0)
           ) && (iVar1 = parse_integer(&CStack_28,(BIGNUM **)&dsa->write_params), iVar1 != 0)) &&
         (((iVar1 = parse_integer(&CStack_28,(BIGNUM **)&dsa->p), iVar1 != 0 &&
           (iVar1 = parse_integer(&CStack_28,(BIGNUM **)&dsa->q), iVar1 != 0)) &&
          (CStack_28.len == 0)))) {
        iVar1 = dsa_check_key((DSA *)dsa);
        pDVar2 = (DSA *)0x0;
        if (iVar1 == 0) {
          pDVar2 = dsa;
          dsa = (DSA *)0x0;
        }
        goto LAB_00180b6c;
      }
      iVar1 = 0x69;
      line = 0xe7;
    }
    else {
      iVar1 = 0x68;
      line = 0xdd;
    }
    ERR_put_error(10,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                  ,line);
    dsa = (DSA *)0x0;
  }
LAB_00180b6c:
  if (pDVar2 != (DSA *)0x0) {
    DSA_free(pDVar2);
  }
  return (DSA *)dsa;
}

Assistant:

DSA *DSA_parse_private_key(CBS *cbs) {
  bssl::UniquePtr<DSA> ret(DSA_new());
  if (ret == nullptr) {
    return nullptr;
  }

  CBS child;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&child, &version)) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    return nullptr;
  }

  if (version != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_BAD_VERSION);
    return nullptr;
  }

  if (!parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->q) ||
      !parse_integer(&child, &ret->g) ||
      !parse_integer(&child, &ret->pub_key) ||
      !parse_integer(&child, &ret->priv_key) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    return nullptr;
  }
  if (!dsa_check_key(ret.get())) {
    return nullptr;
  }

  return ret.release();
}